

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

decNumber_conflict * decNumberFromInt32(decNumber_conflict *dn,int32_t in)

{
  uint32_t local_18;
  uint32_t unsig;
  int32_t in_local;
  decNumber_conflict *dn_local;
  
  local_18 = in;
  if (in < 0) {
    if (in == -0x80000000) {
      local_18 = 0x80000000;
    }
    else {
      local_18 = -in;
    }
  }
  decNumberFromUInt32(dn,local_18);
  if (in < 0) {
    dn->bits = 0x80;
  }
  return dn;
}

Assistant:

decNumber * decNumberFromInt32(decNumber *dn, Int in) {
  uInt unsig;
  if (in>=0) unsig=in;
   else {				/* negative (possibly BADINT) */
    if (in==BADINT) unsig=(uInt)1073741824*2; /* special case */
     else unsig=-in;			/* invert */
    }
  /* in is now positive */
  decNumberFromUInt32(dn, unsig);
  if (in<0) dn->bits=DECNEG;		/* sign needed */
  return dn;
  }